

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

HelicsCore helicsCreateCoreFromArgs(char *type,char *name,int argc,char **argv,HelicsError *err)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  string_view type_00;
  _Alloc_hider _Var1;
  CoreType CVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char **__args;
  _Alloc_hider _Var6;
  int iVar7;
  string_view coreName;
  string_view newError;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  __single_object core;
  _Alloc_hider in_stack_ffffffffffffff38;
  size_type sStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [24];
  undefined8 uStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> local_60;
  MasterObjectHolder *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (type == (char *)0x0) {
      CVar2 = DEFAULT;
    }
    else {
      strlen(type);
      type_00._M_str = in_stack_ffffffffffffff38._M_p;
      type_00._M_len = 0x19845a;
      CVar2 = helics::core::coreTypeFromString(type_00);
    }
    if (CVar2 != UNRECOGNIZED) {
      local_80._M_dataplus._M_p = (pointer)operator_new(0x48);
      local_80._M_dataplus._M_p[0x40] = '\0';
      local_80._M_dataplus._M_p[0x41] = '\0';
      local_80._M_dataplus._M_p[0x42] = '\0';
      local_80._M_dataplus._M_p[0x43] = '\0';
      local_80._M_dataplus._M_p[0x44] = '\0';
      local_80._M_dataplus._M_p[0x45] = '\0';
      local_80._M_dataplus._M_p[0x46] = '\0';
      local_80._M_dataplus._M_p[0x47] = '\0';
      local_80._M_dataplus._M_p[0] = '\0';
      local_80._M_dataplus._M_p[1] = '\0';
      local_80._M_dataplus._M_p[2] = '\0';
      local_80._M_dataplus._M_p[3] = '\0';
      local_80._M_dataplus._M_p[4] = '\0';
      local_80._M_dataplus._M_p[5] = '\0';
      local_80._M_dataplus._M_p[6] = '\0';
      local_80._M_dataplus._M_p[7] = '\0';
      local_80._M_dataplus._M_p[8] = '\0';
      local_80._M_dataplus._M_p[9] = '\0';
      local_80._M_dataplus._M_p[10] = '\0';
      local_80._M_dataplus._M_p[0xb] = '\0';
      local_80._M_dataplus._M_p[0xc] = '\0';
      local_80._M_dataplus._M_p[0xd] = '\0';
      local_80._M_dataplus._M_p[0xe] = '\0';
      local_80._M_dataplus._M_p[0xf] = '\0';
      local_80._M_dataplus._M_p[0x10] = '\0';
      local_80._M_dataplus._M_p[0x11] = '\0';
      local_80._M_dataplus._M_p[0x12] = '\0';
      local_80._M_dataplus._M_p[0x13] = '\0';
      local_80._M_dataplus._M_p[0x14] = '\0';
      local_80._M_dataplus._M_p[0x15] = '\0';
      local_80._M_dataplus._M_p[0x16] = '\0';
      local_80._M_dataplus._M_p[0x17] = '\0';
      local_80._M_dataplus._M_p[0x18] = '\0';
      local_80._M_dataplus._M_p[0x19] = '\0';
      local_80._M_dataplus._M_p[0x1a] = '\0';
      local_80._M_dataplus._M_p[0x1b] = '\0';
      local_80._M_dataplus._M_p[0x1c] = '\0';
      local_80._M_dataplus._M_p[0x1d] = '\0';
      local_80._M_dataplus._M_p[0x1e] = '\0';
      local_80._M_dataplus._M_p[0x1f] = '\0';
      local_80._M_dataplus._M_p[0x20] = '\0';
      local_80._M_dataplus._M_p[0x21] = '\0';
      local_80._M_dataplus._M_p[0x22] = '\0';
      local_80._M_dataplus._M_p[0x23] = '\0';
      local_80._M_dataplus._M_p[0x24] = '\0';
      local_80._M_dataplus._M_p[0x25] = '\0';
      local_80._M_dataplus._M_p[0x26] = '\0';
      local_80._M_dataplus._M_p[0x27] = '\0';
      local_80._M_dataplus._M_p[0x28] = '\0';
      local_80._M_dataplus._M_p[0x29] = '\0';
      local_80._M_dataplus._M_p[0x2a] = '\0';
      local_80._M_dataplus._M_p[0x2b] = '\0';
      local_80._M_dataplus._M_p[0x2c] = '\0';
      local_80._M_dataplus._M_p[0x2d] = '\0';
      local_80._M_dataplus._M_p[0x2e] = '\0';
      local_80._M_dataplus._M_p[0x2f] = '\0';
      local_80._M_dataplus._M_p[0x30] = '\0';
      local_80._M_dataplus._M_p[0x31] = '\0';
      local_80._M_dataplus._M_p[0x32] = '\0';
      local_80._M_dataplus._M_p[0x33] = '\0';
      local_80._M_dataplus._M_p[0x34] = '\0';
      local_80._M_dataplus._M_p[0x35] = '\0';
      local_80._M_dataplus._M_p[0x36] = '\0';
      local_80._M_dataplus._M_p[0x37] = '\0';
      local_80._M_dataplus._M_p[0x38] = '\0';
      local_80._M_dataplus._M_p[0x39] = '\0';
      local_80._M_dataplus._M_p[0x3a] = '\0';
      local_80._M_dataplus._M_p[0x3b] = '\0';
      local_80._M_dataplus._M_p[0x3c] = '\0';
      local_80._M_dataplus._M_p[0x3d] = '\0';
      local_80._M_dataplus._M_p[0x3e] = '\0';
      local_80._M_dataplus._M_p[0x3f] = '\0';
      local_80._M_dataplus._M_p[0x44] = -2;
      local_80._M_dataplus._M_p[0x45] = -1;
      local_80._M_dataplus._M_p[0x46] = -1;
      local_80._M_dataplus._M_p[0x47] = -1;
      local_80._M_dataplus._M_p[0x44] = -0x14;
      local_80._M_dataplus._M_p[0x45] = '$';
      local_80._M_dataplus._M_p[0x46] = -0x7c;
      local_80._M_dataplus._M_p[0x47] = '7';
      local_a8._16_8_ = (pointer)0x0;
      local_a8._0_8_ = (pointer)0x0;
      local_a8._8_8_ = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8,(long)argc - 1);
      __args = argv + (uint)argc;
      iVar7 = argc + 1;
      while( true ) {
        __args = __args + -1;
        iVar7 = iVar7 + -1;
        if (iVar7 < 2) break;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_a8,
                   __args);
      }
      _Var6._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      pcVar4 = (char *)gHelicsEmptyStr_abi_cxx11_._M_string_length;
      if (name != (char *)0x0) {
        pcVar4 = (char *)strlen(name);
        _Var6._M_p = name;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8);
      coreName._M_len = (ulong)CVar2;
      coreName._M_str = pcVar4;
      helics::CoreFactory::FindOrCreate
                ((CoreType)&stack0xffffffffffffff38,coreName,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)_Var6._M_p);
      _Var6._M_p = (pointer)0x0;
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_80._M_dataplus._M_p + 8);
      *(pointer *)local_80._M_dataplus._M_p = in_stack_ffffffffffffff38._M_p;
      *(size_type *)(local_80._M_dataplus._M_p + 8) = sStack_c0;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      _Var1._M_p = local_80._M_dataplus._M_p;
      getMasterHolder();
      local_60._M_t.
      super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
      super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
      super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl =
           (__uniq_ptr_data<helics::CoreObject,_std::default_delete<helics::CoreObject>,_true,_true>
           )(__uniq_ptr_data<helics::CoreObject,_std::default_delete<helics::CoreObject>,_true,_true>
             )local_80._M_dataplus._M_p;
      local_80._M_dataplus._M_p = (pointer)0x0;
      MasterObjectHolder::addCore((MasterObjectHolder *)_Var6._M_p,&local_60);
      std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
                (&local_60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
      std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
                ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                 &local_80);
      return _Var1._M_p;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      getMasterHolder();
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"core type ","");
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_80,type);
      _Var6._M_p = (pbVar3->_M_dataplus)._M_p;
      paVar5 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p == paVar5) {
        local_b8._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_b8._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        _Var6._M_p = (pointer)&local_b8;
      }
      else {
        local_b8._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xffffffffffffff38," is not recognized");
      local_a8._0_8_ = (pbVar3->_M_dataplus)._M_p;
      paVar5 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ == paVar5) {
        local_a8._16_8_ = paVar5->_M_allocated_capacity;
        uStack_90 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_a8._0_8_ = (pointer)(local_a8 + 0x10);
      }
      else {
        local_a8._16_8_ = paVar5->_M_allocated_capacity;
      }
      local_a8._8_8_ = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      newError._M_str = (char *)local_a8._0_8_;
      newError._M_len = local_a8._8_8_;
      pcVar4 = MasterObjectHolder::addErrorString(local_58,newError);
      err->message = pcVar4;
      if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_a8._16_8_)->_M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_b8) {
        operator_delete(_Var6._M_p,local_b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
    }
  }
  return (HelicsCore)0x0;
}

Assistant:

HelicsCore helicsCreateCoreFromArgs(const char* type, const char* name, int argc, const char* const* argv, HelicsError* err)
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    const helics::CoreType coretype = (type != nullptr) ? helics::core::coreTypeFromString(type) : helics::CoreType::DEFAULT;

    if (coretype == helics::CoreType::UNRECOGNIZED) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string("core type ") + type + " is not recognized");
        }
        return nullptr;
    }
    auto core = std::make_unique<helics::CoreObject>();
    try {
        core->valid = gCoreValidationIdentifier;
        std::vector<std::string> args;
        args.reserve(static_cast<size_t>(argc) - 1);
        for (int ii = argc - 1; ii > 0; ii--) {
            args.emplace_back(argv[ii]);
        }
        core->coreptr = helics::CoreFactory::FindOrCreate(coretype, AS_STRING_VIEW(name), args);

        auto* retcore = reinterpret_cast<HelicsCore>(core.get());
        getMasterHolder()->addCore(std::move(core));

        return retcore;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}